

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O2

int TIFFUnsetField(TIFF *tif,uint32_t tag)

{
  undefined8 *puVar1;
  uint32_t *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  uint uVar5;
  TIFFTagValue *pTVar6;
  byte bVar7;
  undefined8 uVar8;
  int iVar9;
  TIFFField *pTVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  pTVar10 = TIFFFieldWithTag(tif,tag);
  if (pTVar10 == (TIFFField *)0x0) {
    iVar9 = 0;
  }
  else {
    uVar4 = pTVar10->field_bit;
    if (uVar4 == 0x41) {
      uVar5 = (tif->tif_dir).td_customValueCount;
      uVar13 = 0;
      uVar11 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar11 = uVar13;
      }
      lVar14 = 0x10;
      for (; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        pTVar6 = (tif->tif_dir).td_customValues;
        if (**(uint32_t **)((long)pTVar6 + lVar14 + -0x10) == tag) {
          _TIFFfreeExt(tif,*(void **)((long)&pTVar6->info + lVar14));
          lVar14 = lVar14 + -0x10;
          for (; lVar12 = (long)(tif->tif_dir).td_customValueCount + -1, (long)uVar13 < lVar12;
              uVar13 = uVar13 + 1) {
            pTVar6 = (tif->tif_dir).td_customValues;
            *(undefined8 *)((long)&pTVar6->value + lVar14) =
                 *(undefined8 *)((long)&pTVar6[1].value + lVar14);
            puVar3 = (undefined8 *)((long)&pTVar6[1].info + lVar14);
            uVar8 = puVar3[1];
            puVar1 = (undefined8 *)((long)&pTVar6->info + lVar14);
            *puVar1 = *puVar3;
            puVar1[1] = uVar8;
            lVar14 = lVar14 + 0x18;
          }
          (tif->tif_dir).td_customValueCount = (int)lVar12;
          break;
        }
        lVar14 = lVar14 + 0x18;
      }
    }
    else {
      bVar7 = (byte)uVar4 & 0x1f;
      puVar2 = (tif->tif_dir).td_fieldsset + (uVar4 >> 5);
      *puVar2 = *puVar2 & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
    }
    *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 8;
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int TIFFUnsetField(TIFF *tif, uint32_t tag)
{
    const TIFFField *fip = TIFFFieldWithTag(tif, tag);
    TIFFDirectory *td = &tif->tif_dir;

    if (!fip)
        return 0;

    if (fip->field_bit != FIELD_CUSTOM)
        TIFFClrFieldBit(tif, fip->field_bit);
    else
    {
        TIFFTagValue *tv = NULL;
        int i;

        for (i = 0; i < td->td_customValueCount; i++)
        {

            tv = td->td_customValues + i;
            if (tv->info->field_tag == tag)
                break;
        }

        if (i < td->td_customValueCount)
        {
            _TIFFfreeExt(tif, tv->value);
            for (; i < td->td_customValueCount - 1; i++)
            {
                td->td_customValues[i] = td->td_customValues[i + 1];
            }
            td->td_customValueCount--;
        }
    }

    tif->tif_flags |= TIFF_DIRTYDIRECT;

    return (1);
}